

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

subtree_ref_base<false> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::child
          (subtree_ref_base<false> *this,size_t k)

{
  value_type index;
  size_t sVar1;
  value_type vVar2;
  subtree_ref_base<false> *psVar3;
  size_t sVar4;
  value_type vVar5;
  subtree_ref_base<false> *in_RDX;
  subtree_ref_base<false> *in_RSI;
  subtree_ref_base<false> *in_RDI;
  size_t r;
  size_t s;
  size_t h;
  size_t p;
  size_t in_stack_fffffffffffffee8;
  subtree_ref_base<false> *in_stack_fffffffffffffef0;
  size_t local_108;
  size_t local_f0;
  size_t local_e0;
  
  pointers(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  index = item_reference::operator_cast_to_unsigned_long
                    ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                      *)0x138be8);
  sVar1 = height(in_RSI);
  if (in_RDX == (subtree_ref_base<false> *)0x0) {
    sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_e0 = item_reference::operator_cast_to_unsigned_long
                         ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                           *)0x138c40);
  }
  else {
    psVar3 = (subtree_ref_base<false> *)degree(in_RSI);
    if (in_RDX == psVar3) {
      local_f0 = size(in_RSI);
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar5 = item_reference::operator_cast_to_unsigned_long
                        ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x138cb0);
      local_f0 = local_f0 - vVar5;
    }
    else {
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar5 = item_reference::operator_cast_to_unsigned_long
                        ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x138cf1);
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar2 = item_reference::operator_cast_to_unsigned_long
                        ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x138d29);
      local_f0 = vVar5 - vVar2;
    }
    local_e0 = local_f0;
  }
  if (in_RDX == (subtree_ref_base<false> *)0x0) {
    ranks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_108 = item_reference::operator_cast_to_unsigned_long
                          ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                            *)0x138d8a);
  }
  else {
    psVar3 = (subtree_ref_base<false> *)degree(in_RSI);
    if (in_RDX == psVar3) {
      sVar4 = rank(in_RSI);
      ranks(in_RDX,in_stack_fffffffffffffee8);
      local_108 = item_reference::operator_cast_to_unsigned_long
                            ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                              *)0x138dfa);
      local_108 = sVar4 - local_108;
    }
    else {
      ranks(in_RDX,in_stack_fffffffffffffee8);
      local_108 = item_reference::operator_cast_to_unsigned_long
                            ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                              *)0x138e35);
      ranks(in_RDX,in_stack_fffffffffffffee8);
      vVar5 = item_reference::operator_cast_to_unsigned_long
                        ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x138e63);
      local_108 = local_108 - vVar5;
    }
  }
  subtree_ref_base(in_RDI,in_RSI->_vector,index,sVar1 - 1,local_e0,local_108);
  return in_RDI;
}

Assistant:

subtree_ref_base child(size_t k) const
            {
                assert(is_node());
                assert(k <= degree());
                assert(pointers(k) != 0);
                
                size_t p = pointers(k);
                size_t h = height() - 1;
                
                // Size of the subtree
                size_t s = k == 0        ? sizes(k) :
                           k == degree() ? size()   - sizes(k - 1) :
                                           sizes(k) - sizes(k - 1);
                
                // Rank of the subtree
                size_t r = k == 0        ? ranks(k) :
                           k == degree() ? rank()   - ranks(k - 1) :
                                           ranks(k) - ranks(k - 1);
                
                return { _vector, p, h, s, r };
            }